

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

Expression *
slang::ast::DataTypeExpression::fromSyntax
          (Compilation *compilation,DataTypeSyntax *syntax,ASTContext *context)

{
  Type *args_1;
  Expression *pEVar1;
  TypeReferenceExpression *pTVar2;
  Type *args;
  SourceRange sourceRange;
  SourceRange local_30;
  
  args_1 = Compilation::getType(compilation,syntax,context,(Type *)0x0);
  if (((syntax->super_ExpressionSyntax).super_SyntaxNode.kind == TypeReference) &&
     (((context->flags).m_bits & 0x20000) != 0)) {
    args = Compilation::getTypeRefType(compilation);
    local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pTVar2 = BumpAllocator::
             emplace<slang::ast::TypeReferenceExpression,slang::ast::Type_const&,slang::ast::Type_const&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,args,args_1,&local_30);
  }
  else {
    if (((context->flags).m_bits & 4) == 0) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      ASTContext::addDiag(context,(DiagCode)0x10001,sourceRange);
      pEVar1 = Expression::badExpr(compilation,(Expression *)0x0);
      return pEVar1;
    }
    local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pTVar2 = (TypeReferenceExpression *)
             BumpAllocator::
             emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,args_1,&local_30);
  }
  return &pTVar2->super_Expression;
}

Assistant:

Expression& DataTypeExpression::fromSyntax(Compilation& compilation, const DataTypeSyntax& syntax,
                                           const ASTContext& context) {
    const Type& type = compilation.getType(syntax, context);
    if (syntax.kind == SyntaxKind::TypeReference &&
        context.flags.has(ASTFlags::AllowTypeReferences)) {
        return *compilation.emplace<TypeReferenceExpression>(compilation.getTypeRefType(), type,
                                                             syntax.sourceRange());
    }

    if (!context.flags.has(ASTFlags::AllowDataType)) {
        context.addDiag(diag::ExpectedExpression, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<DataTypeExpression>(type, syntax.sourceRange());
}